

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes SzReadStreamsInfo(CSzAr *p,CSzData *sd,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                      UInt64 *dataOffset,CSubStreamInfo *ssi,ISzAlloc *alloc)

{
  Byte BVar1;
  CSzAr *pCVar2;
  Byte BVar3;
  SRes SVar4;
  SRes SVar5;
  UInt32 UVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t *psVar10;
  UInt32 *pUVar11;
  Byte *pBVar12;
  ulong uVar13;
  UInt64 *pUVar14;
  char cVar15;
  byte *pbVar16;
  ulong uVar17;
  byte *pbVar18;
  ulong uVar19;
  UInt64 UVar20;
  uint uVar21;
  byte bVar22;
  CSzData *pCVar23;
  CSzAr *pCVar24;
  size_t __n;
  CSzAr *pCVar25;
  int iVar26;
  int iVar27;
  size_t sVar28;
  bool bVar29;
  UInt32 index_1;
  CSzData sd_1;
  UInt64 type;
  UInt32 numFolders;
  UInt32 numCoders;
  UInt64 packSize;
  UInt32 coderOutStreams;
  UInt32 local_12c;
  uint local_128;
  uint local_10c;
  CSzData local_108;
  ulong local_f0;
  ulong local_e8;
  CSzData *local_e0;
  UInt64 local_d8;
  uint local_cc;
  CSzAr *local_c8;
  uint local_c0;
  uint local_bc;
  UInt64 local_b8 [8];
  uint local_78 [18];
  
  (ssi->sdCRCs).Data = (Byte *)0x0;
  (ssi->sdCRCs).Size = 0;
  (ssi->sdSizes).Data = (Byte *)0x0;
  (ssi->sdSizes).Size = 0;
  (ssi->sdNumSubStreams).Data = (Byte *)0x0;
  (ssi->sdNumSubStreams).Size = 0;
  *dataOffset = 0;
  SVar4 = ReadNumber(sd,&local_d8);
  if (SVar4 != 0) {
    return SVar4;
  }
  pCVar25 = (CSzAr *)alloc;
  if (local_d8 == 6) {
    SVar4 = ReadNumber(sd,dataOffset);
    if (SVar4 != 0) {
      return SVar4;
    }
    SVar5 = SzReadNumber32(sd,&p->NumPackStreams);
    SVar4 = SVar5;
    if ((SVar5 == 0) && (SVar4 = WaitId(sd,9), SVar4 == 0)) {
      pUVar14 = (UInt64 *)(*alloc->Alloc)(alloc,(ulong)p->NumPackStreams * 8 + 8);
      p->PackPositions = pUVar14;
      if (pUVar14 == (UInt64 *)0x0) {
        SVar4 = 2;
      }
      else {
        pCVar25 = (CSzAr *)(ulong)p->NumPackStreams;
        bVar29 = pCVar25 != (CSzAr *)0x0;
        if (pCVar25 == (CSzAr *)0x0) {
          pCVar24 = (CSzAr *)0x0;
          UVar20 = 0;
LAB_005ce454:
          p->PackPositions[(long)pCVar24] = UVar20;
          SVar4 = SVar5;
        }
        else {
          *p->PackPositions = 0;
          SVar4 = ReadNumber(sd,local_b8);
          bVar29 = true;
          if (SVar4 == 0) {
            UVar20 = local_b8[0];
            pCVar2 = (CSzAr *)0x1;
            do {
              pCVar24 = pCVar2;
              if (pCVar25 == pCVar24) {
                bVar29 = false;
                goto LAB_005ce454;
              }
              p->PackPositions[(long)pCVar24] = UVar20;
              SVar4 = ReadNumber(sd,local_b8);
              if (SVar4 != 0) {
                SVar5 = 0;
              }
              UVar20 = UVar20 + local_b8[0];
              if (UVar20 < local_b8[0]) {
                SVar5 = 0x10;
              }
            } while ((SVar4 == 0) &&
                    (pCVar2 = (CSzAr *)((long)&pCVar24->NumPackStreams + 1), SVar4 = SVar5,
                    local_b8[0] <= UVar20));
            bVar29 = pCVar24 < pCVar25;
          }
        }
        if (!bVar29) {
          do {
            SVar5 = ReadNumber(sd,local_b8);
            bVar29 = true;
            if (SVar5 == 0) {
              if (local_b8[0] == 0) {
                SVar5 = 0;
              }
              else {
                if (local_b8[0] == 10) {
                  iVar27 = SkipBitUi32s(sd,p->NumPackStreams);
                }
                else {
                  iVar27 = SkipData(sd);
                }
                bVar29 = iVar27 != 0;
                SVar5 = SVar4;
                if (bVar29) {
                  SVar5 = iVar27;
                }
              }
            }
            SVar4 = SVar5;
          } while (!bVar29);
        }
      }
    }
    if (SVar4 != 0) {
      return SVar4;
    }
    SVar4 = ReadNumber(sd,&local_d8);
    if (SVar4 != 0) {
      return SVar4;
    }
  }
  if (local_d8 != 7) goto LAB_005ceb87;
  local_12c = WaitId(sd,0xb);
  UVar6 = local_12c;
  if ((local_12c == 0) && (UVar6 = SzReadNumber32(sd,&local_c0), UVar6 == 0)) {
    pCVar24 = (CSzAr *)(ulong)local_c0;
    pCVar25 = pCVar24;
    UVar6 = 4;
    if (local_c0 <= numFoldersMax) {
      p->NumFolders = local_c0;
      UVar6 = 0x10;
      if (sd->Size != 0) {
        sd->Size = sd->Size - 1;
        pBVar12 = sd->Data;
        sd->Data = pBVar12 + 1;
        BVar1 = *pBVar12;
        if (BVar1 == '\0') {
          local_108.Data = sd->Data;
          local_108.Size = sd->Size;
        }
        else {
          SVar4 = SzReadNumber32(sd,(UInt32 *)local_b8);
          if (SVar4 == 0) {
            if (numTempBufs <= (uint)local_b8[0]) {
              SVar4 = 0x10;
              goto LAB_005ce4d9;
            }
            local_108.Data = tempBufs[local_b8[0] & 0xffffffff].data;
            local_108.Size = tempBufs[local_b8[0] & 0xffffffff].size;
            bVar29 = true;
          }
          else {
LAB_005ce4d9:
            local_12c = SVar4;
            bVar29 = false;
          }
          UVar6 = local_12c;
          if (!bVar29) goto LAB_005ceb5a;
        }
        psVar10 = (size_t *)(*alloc->Alloc)(alloc,(long)pCVar24 * 8 + 8);
        p->FoCodersOffsets = psVar10;
        UVar6 = 2;
        pCVar25 = (CSzAr *)alloc;
        if (psVar10 != (size_t *)0x0) {
          sVar28 = (long)pCVar24 * 4 + 4;
          local_c8 = pCVar24;
          pUVar11 = (UInt32 *)(*alloc->Alloc)(alloc,sVar28);
          p->FoStartPackStreamIndex = pUVar11;
          if (pUVar11 != (UInt32 *)0x0) {
            pUVar11 = (UInt32 *)(*alloc->Alloc)(alloc,sVar28);
            pCVar24 = local_c8;
            p->FoToCoderUnpackSizes = pUVar11;
            if (pUVar11 != (UInt32 *)0x0) {
              pBVar12 = (Byte *)(*alloc->Alloc)(alloc,(size_t)local_c8);
              p->FoToMainUnpackSizeIndex = pBVar12;
              if (pBVar12 != (Byte *)0x0) {
                local_e0 = (CSzData *)local_108.Data;
                pCVar23 = (CSzData *)local_108.Data;
                if ((int)pCVar24 == 0) {
                  UVar6 = 0;
                  local_128 = 0;
                  uVar13 = 0;
                }
                else {
                  pCVar24 = (CSzAr *)0x0;
                  local_128 = 0;
                  local_e8 = 0;
                  do {
                    p->FoCodersOffsets[(long)pCVar24] = (long)local_108.Data - (long)pCVar23;
                    UVar6 = SzReadNumber32(&local_108,&local_bc);
                    uVar9 = local_bc;
                    if (UVar6 == 0) {
                      uVar13 = (ulong)local_bc;
                      __n = 0;
                      if (0xffffffbf < local_bc - 0x41) {
                        if (local_bc != 0) {
                          __n = 0;
                          uVar8 = local_bc;
                          do {
                            if (local_108.Size == 0) {
                              bVar29 = false;
                              local_12c = 0x10;
                            }
                            else {
                              uVar19 = local_108.Size - 1;
                              pbVar16 = local_108.Data + 1;
                              bVar22 = *local_108.Data;
                              local_108.Data = pbVar16;
                              if ((bVar22 < 0x40) &&
                                 (uVar7 = bVar22 & 0xf, uVar17 = (ulong)uVar7, uVar7 < 9)) {
                                local_108.Size = uVar19 - uVar17;
                                if (uVar19 < uVar17) {
                                  bVar29 = false;
                                  local_12c = 0x10;
                                  local_108.Size = uVar19;
                                }
                                else {
                                  local_108.Data = pbVar16 + uVar17;
                                  local_b8[0] = CONCAT44(local_b8[0]._4_4_,1);
                                  if ((bVar22 & 0x10) != 0) {
                                    UVar6 = SzReadNumber32(&local_108,(UInt32 *)local_b8);
                                    if ((UVar6 == 0) &&
                                       (UVar6 = SzReadNumber32(&local_108,local_78), UVar6 == 0)) {
                                      bVar29 = local_78[0] == 1 && (uint)local_b8[0] < 0x41;
                                      if (local_78[0] != 1 || (uint)local_b8[0] >= 0x41) {
                                        local_12c = 4;
                                      }
                                    }
                                    else {
                                      local_12c = UVar6;
                                      bVar29 = false;
                                    }
                                    if (!bVar29) {
                                      bVar29 = false;
                                      goto LAB_005ce647;
                                    }
                                  }
                                  __n = (size_t)((int)__n + (uint)local_b8[0]);
                                  bVar29 = true;
                                  if (0x1f < bVar22) {
                                    UVar6 = SzReadNumber32(&local_108,local_78);
                                    if (UVar6 == 0) {
                                      uVar19 = (ulong)local_78[0];
                                      if (uVar19 <= local_108.Size) {
                                        bVar29 = true;
                                        local_108.Data = local_108.Data + uVar19;
                                        local_108.Size = local_108.Size - uVar19;
                                        goto LAB_005ce647;
                                      }
                                      local_12c = 0x10;
                                      UVar6 = local_12c;
                                    }
                                    local_12c = UVar6;
                                    bVar29 = false;
                                  }
                                }
                              }
                              else {
                                bVar29 = false;
                                local_12c = 4;
                                local_108.Size = uVar19;
                              }
                            }
LAB_005ce647:
                            if (!bVar29) {
                              pCVar25 = (CSzAr *)0x0;
                              pCVar23 = local_e0;
                              goto LAB_005ce81f;
                            }
                            uVar8 = uVar8 - 1;
                          } while (uVar8 != 0);
                        }
                        uVar8 = (uint)__n;
                        if ((uVar9 == 1) && (uVar8 == 1)) {
                          BVar3 = '\0';
                          uVar7 = 1;
                          uVar9 = (uint)local_e8;
                          uVar8 = 1;
                        }
                        else {
                          uVar9 = uVar9 - 1;
                          if (uVar8 < uVar9) {
                            local_12c = 0x10;
LAB_005ce7d2:
                            uVar8 = (uint)uVar13;
                            BVar3 = '\0';
                            bVar29 = false;
                            uVar9 = (uint)local_e8;
                            uVar7 = 1;
                          }
                          else {
                            if (0x40 < uVar8) {
                              local_12c = 4;
                              goto LAB_005ce7d2;
                            }
                            local_f0 = uVar13;
                            local_cc = uVar8 - uVar9;
                            if (uVar8 != 0) {
                              memset(local_b8,0,__n);
                            }
                            if ((uint)local_f0 != 0) {
                              memset(local_78,0,local_f0);
                            }
                            if (uVar9 != 0) {
                              iVar27 = 1;
                              do {
                                SVar4 = SzReadNumber32(&local_108,&local_10c);
                                if (SVar4 == 0) {
                                  if ((local_10c < uVar8) &&
                                     (*(char *)((long)local_b8 + (ulong)local_10c) == '\0')) {
                                    *(undefined1 *)((long)local_b8 + (ulong)local_10c) = 1;
                                    SVar4 = SzReadNumber32(&local_108,&local_10c);
                                    if (SVar4 == 0) {
                                      if (local_10c < (uint)local_f0) {
                                        cVar15 = *(char *)((long)local_78 + (ulong)local_10c);
                                        bVar29 = cVar15 == '\0';
                                        *(char *)((long)local_78 + (ulong)local_10c) =
                                             cVar15 + (cVar15 == '\0');
                                        if (!bVar29) {
                                          local_12c = 0x10;
                                        }
                                      }
                                      else {
                                        bVar29 = false;
                                        local_12c = 0x10;
                                      }
                                    }
                                    else {
                                      bVar29 = false;
                                      local_12c = SVar4;
                                    }
                                  }
                                  else {
                                    bVar29 = false;
                                    local_12c = 0x10;
                                  }
                                }
                                else {
                                  bVar29 = false;
                                  local_12c = SVar4;
                                }
                                uVar13 = local_f0;
                                if (!bVar29) goto LAB_005ce7d2;
                                iVar27 = iVar27 + 1;
                              } while ((int)local_f0 != iVar27);
                            }
                            if (1 < local_cc) {
                              do {
                                UVar6 = SzReadNumber32(&local_108,&local_10c);
                                if (UVar6 == 0) {
                                  if (uVar8 <= local_10c) {
                                    local_12c = 0x10;
                                    UVar6 = local_12c;
                                    goto LAB_005ce9e0;
                                  }
                                  cVar15 = *(char *)((long)local_b8 + (ulong)local_10c);
                                  bVar29 = cVar15 == '\0';
                                  *(char *)((long)local_b8 + (ulong)local_10c) =
                                       cVar15 + (cVar15 == '\0');
                                  if (!bVar29) {
                                    local_12c = 0x10;
                                  }
                                }
                                else {
LAB_005ce9e0:
                                  local_12c = UVar6;
                                  bVar29 = false;
                                }
                                if (!bVar29) {
                                  BVar3 = '\0';
                                  bVar29 = false;
                                  uVar9 = (uint)local_e8;
                                  goto LAB_005cea6e;
                                }
                                uVar9 = uVar9 + 1;
                              } while (uVar8 != uVar9);
                            }
                            if ((uint)local_f0 == 0) {
                              uVar13 = 0;
                              BVar3 = '\0';
                            }
                            else {
                              uVar13 = 0;
                              do {
                                if (*(char *)((long)local_78 + uVar13) == '\0') {
                                  BVar3 = (Byte)uVar13;
                                  goto LAB_005cea4d;
                                }
                                uVar13 = uVar13 + 1;
                              } while (local_f0 != uVar13);
                              BVar3 = '\0';
                              uVar13 = local_f0 & 0xffffffff;
                            }
LAB_005cea4d:
                            bVar29 = (int)uVar13 != (uint)local_f0;
                            if (!bVar29) {
                              local_12c = 0x10;
                            }
                            uVar9 = (uint)local_e8;
LAB_005cea6e:
                            uVar8 = (uint)local_f0;
                            uVar7 = local_cc;
                          }
                          pCVar23 = local_e0;
                          UVar6 = local_12c;
                          if (!bVar29) goto LAB_005ce5ce;
                        }
                        p->FoStartPackStreamIndex[(long)pCVar24] = uVar9;
                        p->FoToCoderUnpackSizes[(long)pCVar24] = local_128;
                        p->FoToMainUnpackSizeIndex[(long)pCVar24] = BVar3;
                        bVar29 = CARRY4(uVar8,local_128);
                        local_128 = uVar8 + local_128;
                        pCVar23 = local_e0;
                        if (!bVar29) {
                          uVar8 = uVar9 + uVar7;
                          local_e8 = (ulong)uVar8;
                          if (!CARRY4(uVar9,uVar7)) {
                            pCVar25 = (CSzAr *)CONCAT71((int7)(__n >> 8),uVar8 <= p->NumPackStreams)
                            ;
                            if (p->NumPackStreams < uVar8) {
                              local_12c = 0x10;
                            }
                            goto LAB_005ce81f;
                          }
                        }
                      }
                      pCVar25 = (CSzAr *)0x0;
                      local_12c = 4;
                    }
                    else {
LAB_005ce5ce:
                      local_12c = UVar6;
                      pCVar25 = (CSzAr *)0x0;
                    }
LAB_005ce81f:
                    UVar6 = local_12c;
                    if ((char)pCVar25 == '\0') goto LAB_005ceb5a;
                    pCVar24 = (CSzAr *)((long)&pCVar24->NumPackStreams + 1);
                  } while (pCVar24 != local_c8);
                  uVar13 = (ulong)pCVar24 & 0xffffffff;
                  UVar6 = (UInt32)local_e8;
                }
                p->FoToCoderUnpackSizes[uVar13] = local_128;
                p->FoStartPackStreamIndex[uVar13] = UVar6;
                bVar29 = true;
                sVar28 = (long)local_108.Data - (long)pCVar23;
                p->FoCodersOffsets[uVar13] = sVar28;
                if (sVar28 == 0) {
                  pCVar25 = (CSzAr *)0x0;
                }
                else {
                  pBVar12 = (Byte *)(*alloc->Alloc)(alloc,sVar28);
                  p->CodersData = pBVar12;
                  pCVar25 = p;
                  if (pBVar12 == (Byte *)0x0) {
                    local_12c = 2;
                    bVar29 = false;
                  }
                  else {
                    memcpy(pBVar12,pCVar23,sVar28);
                  }
                }
                UVar6 = local_12c;
                if (bVar29) {
                  if (BVar1 != '\0') {
                    UVar6 = 0x10;
                    if (local_108.Size != 0) goto LAB_005ceb5a;
                    local_108.Data = sd->Data;
                    local_108.Size = sd->Size;
                  }
                  UVar6 = WaitId(&local_108,0xc);
                  if (UVar6 == 0) {
                    uVar13 = (ulong)local_128;
                    if (local_128 == 0) {
                      pCVar25->CoderUnpackSizes = (UInt64 *)0x0;
                    }
                    else {
                      pUVar14 = (UInt64 *)(*alloc->Alloc)(alloc,uVar13 * 8);
                      pCVar25->CoderUnpackSizes = pUVar14;
                      UVar6 = 2;
                      if (pUVar14 == (UInt64 *)0x0) goto LAB_005ceb5a;
                    }
                    bVar29 = local_128 != 0;
                    UVar6 = local_12c;
                    if (bVar29) {
                      UVar6 = ReadNumber(&local_108,pCVar25->CoderUnpackSizes);
                      bVar29 = true;
                      if (UVar6 == 0) {
                        uVar19 = 0;
                        do {
                          uVar19 = uVar19 + 1;
                          UVar6 = local_12c;
                          if (uVar19 == uVar13) break;
                          UVar6 = ReadNumber(&local_108,pCVar25->CoderUnpackSizes + uVar19);
                        } while (UVar6 == 0);
                        bVar29 = uVar19 < uVar13;
                      }
                    }
                    if (!bVar29) {
                      pCVar25 = (CSzAr *)&pCVar25->FolderCRCs;
                      do {
                        SVar4 = ReadNumber(&local_108,local_b8);
                        if (SVar4 == 0) {
                          if (local_b8[0] == 10) {
                            SVar4 = ReadBitUi32s(&local_108,local_c0,(CSzBitUi32s *)pCVar25,alloc);
                            bVar29 = SVar4 == 0;
                            cVar15 = '\x01';
                            if (bVar29) {
                              cVar15 = '\x1b';
                            }
                          }
                          else {
                            if (local_b8[0] == 0) {
                              sd->Data = local_108.Data;
                              sd->Size = local_108.Size;
                              SVar4 = 0;
                              goto LAB_005cf047;
                            }
                            SVar4 = SkipData(&local_108);
                            bVar29 = SVar4 == 0;
                            cVar15 = !bVar29;
                          }
                          if (!bVar29) {
                            UVar6 = SVar4;
                          }
                        }
                        else {
LAB_005cf047:
                          cVar15 = '\x01';
                          UVar6 = SVar4;
                        }
                      } while ((cVar15 == '\0') || (cVar15 == '\x1b'));
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_005ceb5a:
  if (UVar6 != 0) {
    return UVar6;
  }
  SVar4 = ReadNumber(sd,&local_d8);
  if (SVar4 != 0) {
    return SVar4;
  }
LAB_005ceb87:
  if (local_d8 != 8) {
    ssi->NumTotalSubStreams = p->NumFolders;
LAB_005ced66:
    return (uint)(local_d8 != 0) << 2;
  }
  local_e0 = &ssi->sdNumSubStreams;
  local_b8[0] = 0;
  uVar9 = p->NumFolders;
  local_e8 = CONCAT71(local_e8._1_7_,uVar9 != 0);
  iVar27 = 0;
  local_12c = 0;
  uVar8 = uVar9;
LAB_005cebdc:
  uVar7 = ReadNumber(sd,local_b8);
  pCVar25 = (CSzAr *)((ulong)pCVar25 & 0xffffffff);
  if (uVar7 != 0) {
    pCVar25 = (CSzAr *)(ulong)uVar7;
  }
  iVar26 = (int)pCVar25;
  if (uVar7 != 0) goto LAB_005cef4c;
  if ((1 < local_b8[0] - 9) && (local_b8[0] != 0)) {
    if (local_b8[0] != 0xd) {
      uVar7 = SkipData(sd);
      if (uVar7 != 0) {
        pCVar25 = (CSzAr *)(ulong)uVar7;
      }
      iVar26 = (int)pCVar25;
      if (uVar7 != 0) goto LAB_005cef4c;
      goto LAB_005cebdc;
    }
    local_e0->Data = sd->Data;
    if (uVar9 == 0) {
      uVar8 = 0;
      local_12c = 0;
      local_c8 = (CSzAr *)CONCAT71(local_c8._1_7_,(undefined1)local_e8);
    }
    else {
      local_12c = 0;
      local_c8 = (CSzAr *)CONCAT71(local_c8._1_7_,(undefined1)local_e8);
      uVar21 = 0;
      uVar7 = 0;
      do {
        uVar8 = SzReadNumber32(sd,local_78);
        if (uVar8 == 0) {
          uVar8 = local_78[0] + uVar7;
          if (CARRY4(local_78[0],uVar7)) {
            pCVar25 = (CSzAr *)0x4;
            goto LAB_005cec98;
          }
          iVar26 = local_78[0] - 1;
          if (local_78[0] == 0) {
            iVar26 = 0;
          }
          iVar27 = iVar26 + iVar27;
          if (((local_78[0] != 1) || (pBVar12 = (p->FolderCRCs).Defs, pBVar12 == (Byte *)0x0)) ||
             (bVar29 = true, -1 < (char)(pBVar12[uVar21 >> 3] << ((byte)uVar21 & 7)))) {
            local_12c = local_12c + local_78[0];
            bVar29 = true;
          }
        }
        else {
          pCVar25 = (CSzAr *)(ulong)uVar8;
LAB_005cec98:
          bVar29 = false;
          uVar8 = uVar7;
        }
        if (!bVar29) goto LAB_005ced3f;
        uVar21 = uVar21 + 1;
        local_c8 = (CSzAr *)CONCAT71(local_c8._1_7_,uVar21 < uVar9);
        uVar7 = uVar8;
      } while (uVar21 != uVar9);
    }
    (ssi->sdNumSubStreams).Size = (long)sd->Data - (long)(ssi->sdNumSubStreams).Data;
LAB_005ced3f:
    iVar26 = (int)pCVar25;
    if (((ulong)local_c8 & 1) != 0) goto LAB_005cef4c;
    goto LAB_005cebdc;
  }
  if ((local_e0->Data == (Byte *)0x0) &&
     (pbVar16 = (p->FolderCRCs).Defs, local_12c = uVar9, pbVar16 != (byte *)0x0)) {
    iVar26 = 0;
    if (uVar9 != 0) {
      uVar21 = 0;
      bVar22 = 0;
      uVar7 = uVar9;
      do {
        if (uVar21 == 0) {
          bVar22 = *pbVar16;
          pbVar16 = pbVar16 + 1;
          uVar21 = 8;
        }
        uVar21 = uVar21 - 1;
        iVar26 = iVar26 + (uint)((bVar22 >> (uVar21 & 0x1f) & 1) != 0);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    local_12c = uVar9 - iVar26;
  }
  ssi->NumTotalSubStreams = uVar8;
  ssi->NumSubDigests = local_12c;
  if (local_b8[0] == 9) {
    (ssi->sdSizes).Data = sd->Data;
    pbVar16 = sd->Data;
    uVar13 = sd->Size;
    uVar19 = uVar13;
    pbVar18 = pbVar16;
    if (iVar27 != 0) {
      do {
        bVar29 = true;
        if (uVar19 == 0) {
          uVar13 = 0;
          pbVar16 = pbVar18;
        }
        else {
          uVar13 = uVar19 - 1;
          pbVar16 = pbVar18 + 1;
          bVar22 = *pbVar18;
          if ((char)bVar22 < '\0') {
            if ((bVar22 & 0x40) == 0) {
              if (uVar13 != 0) {
                uVar13 = uVar19 - 2;
                pbVar16 = pbVar18 + 2;
                goto LAB_005cee28;
              }
              uVar13 = 0;
            }
            else {
              uVar19 = 2;
              if ((bVar22 & 0x20) != 0) {
                uVar9 = 0x20;
                uVar17 = uVar19;
                do {
                  uVar19 = uVar17 + 1;
                  if (6 < (uint)uVar17) break;
                  uVar9 = uVar9 >> 1;
                  uVar17 = uVar19;
                } while ((uVar9 & bVar22) != 0);
              }
              if (uVar19 <= uVar13) {
                pbVar16 = pbVar16 + uVar19;
                bVar29 = false;
                uVar13 = uVar13 - uVar19;
              }
            }
          }
          else {
LAB_005cee28:
            bVar29 = false;
          }
        }
        if (bVar29) {
          uVar9 = 0x10;
          bVar29 = false;
          goto LAB_005ceeaa;
        }
        iVar27 = iVar27 + -1;
        uVar19 = uVar13;
        pbVar18 = pbVar16;
        if (iVar27 == 0) break;
      } while( true );
    }
    sd->Data = pbVar16;
    sd->Size = uVar13;
    uVar9 = 0;
    bVar29 = true;
LAB_005ceeaa:
    if (!bVar29) {
      pCVar25 = (CSzAr *)(ulong)uVar9;
    }
    iVar26 = (int)pCVar25;
    if (bVar29) {
      (ssi->sdSizes).Size = (long)sd->Data - (long)(ssi->sdSizes).Data;
      uVar9 = ReadNumber(sd,local_b8);
      if (uVar9 != 0) {
        pCVar25 = (CSzAr *)(ulong)uVar9;
      }
      iVar26 = (int)pCVar25;
      if (uVar9 == 0) goto LAB_005ceedc;
    }
  }
  else {
LAB_005ceedc:
    do {
      if (local_b8[0] != 10) {
        if (local_b8[0] == 0) {
          iVar26 = 0;
        }
        else {
          uVar9 = SkipData(sd);
          if (uVar9 != 0) {
            pCVar25 = (CSzAr *)(ulong)uVar9;
          }
          iVar26 = (int)pCVar25;
          if (uVar9 == 0) goto LAB_005cef34;
        }
        break;
      }
      (ssi->sdCRCs).Data = sd->Data;
      uVar9 = SkipBitUi32s(sd,local_12c);
      if (uVar9 != 0) {
        pCVar25 = (CSzAr *)(ulong)uVar9;
      }
      iVar26 = (int)pCVar25;
      if (uVar9 != 0) break;
      (ssi->sdCRCs).Size = (long)sd->Data - (long)(ssi->sdCRCs).Data;
LAB_005cef34:
      uVar9 = ReadNumber(sd,local_b8);
      if (uVar9 != 0) {
        pCVar25 = (CSzAr *)(ulong)uVar9;
      }
      iVar26 = (int)pCVar25;
    } while (uVar9 == 0);
  }
LAB_005cef4c:
  if (iVar26 != 0) {
    return iVar26;
  }
  SVar4 = ReadNumber(sd,&local_d8);
  if (SVar4 != 0) {
    return SVar4;
  }
  goto LAB_005ced66;
}

Assistant:

static SRes SzReadStreamsInfo(CSzAr *p,
    CSzData *sd,
    UInt32 numFoldersMax, const CBuf *tempBufs, UInt32 numTempBufs,
    UInt64 *dataOffset,
    CSubStreamInfo *ssi,
    ISzAlloc *alloc)
{
  UInt64 type;

  SzData_Clear(&ssi->sdSizes);
  SzData_Clear(&ssi->sdCRCs);
  SzData_Clear(&ssi->sdNumSubStreams);

  *dataOffset = 0;
  RINOK(ReadID(sd, &type));
  if (type == k7zIdPackInfo)
  {
    RINOK(ReadNumber(sd, dataOffset));
    RINOK(ReadPackInfo(p, sd, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdUnpackInfo)
  {
    RINOK(ReadUnpackInfo(p, sd, numFoldersMax, tempBufs, numTempBufs, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdSubStreamsInfo)
  {
    RINOK(ReadSubStreamsInfo(p, sd, ssi));
    RINOK(ReadID(sd, &type));
  }
  else
  {
    ssi->NumTotalSubStreams = p->NumFolders;
    // ssi->NumSubDigests = 0;
  }

  return (type == k7zIdEnd ? SZ_OK : SZ_ERROR_UNSUPPORTED);
}